

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_cwksp.h
# Opt level: O3

void * ZSTD_cwksp_reserve_table(ZSTD_cwksp *ws,size_t bytes)

{
  void *pvVar1;
  void *pvVar2;
  ulong uVar3;
  
  if (ws->phase == ZSTD_cwksp_alloc_objects) {
    pvVar2 = ws->objectEnd;
    ws->tableValidEnd = pvVar2;
    ws->initOnceStart = (void *)((ulong)ws->workspaceEnd & 0xffffffffffffffc0);
    uVar3 = (ulong)(-(int)pvVar2 & 0x3f);
    pvVar2 = (void *)((long)pvVar2 + uVar3);
    if (ws->workspaceEnd < pvVar2) {
      return (void *)0x0;
    }
    ws->objectEnd = pvVar2;
    ws->tableEnd = pvVar2;
    if (uVar3 != 0) {
      ws->tableValidEnd = pvVar2;
    }
    ws->phase = ZSTD_cwksp_alloc_aligned_init_once;
    ZSTD_cwksp_assert_internal_consistency(ws);
  }
  if ((bytes & 3) != 0) {
    __assert_fail("(bytes & (sizeof(U32)-1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                  ,0x1cb,"void *ZSTD_cwksp_reserve_table(ZSTD_cwksp *, size_t)");
  }
  pvVar2 = ws->tableEnd;
  pvVar1 = ws->allocStart;
  ZSTD_cwksp_assert_internal_consistency(ws);
  if (pvVar1 < (void *)((long)pvVar2 + bytes)) {
    __assert_fail("end <= top",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                  ,0x1cd,"void *ZSTD_cwksp_reserve_table(ZSTD_cwksp *, size_t)");
  }
  ws->tableEnd = (void *)((long)pvVar2 + bytes);
  if ((bytes & 0x3c) == 0) {
    if (((ulong)pvVar2 & 0x3f) == 0) {
      return pvVar2;
    }
    __assert_fail("((size_t)alloc & (ZSTD_CWKSP_ALIGNMENT_BYTES-1))== 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                  ,0x1dc,"void *ZSTD_cwksp_reserve_table(ZSTD_cwksp *, size_t)");
  }
  __assert_fail("(bytes & (ZSTD_CWKSP_ALIGNMENT_BYTES-1)) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                ,0x1db,"void *ZSTD_cwksp_reserve_table(ZSTD_cwksp *, size_t)");
}

Assistant:

MEM_STATIC void* ZSTD_cwksp_reserve_table(ZSTD_cwksp* ws, size_t bytes)
{
    const ZSTD_cwksp_alloc_phase_e phase = ZSTD_cwksp_alloc_aligned_init_once;
    void* alloc;
    void* end;
    void* top;

    /* We can only start allocating tables after we are done reserving space for objects at the
     * start of the workspace */
    if(ws->phase < phase) {
        if (ZSTD_isError(ZSTD_cwksp_internal_advance_phase(ws, phase))) {
            return NULL;
        }
    }
    alloc = ws->tableEnd;
    end = (BYTE *)alloc + bytes;
    top = ws->allocStart;

    DEBUGLOG(5, "cwksp: reserving %p table %zd bytes, %zd bytes remaining",
        alloc, bytes, ZSTD_cwksp_available_space(ws) - bytes);
    assert((bytes & (sizeof(U32)-1)) == 0);
    ZSTD_cwksp_assert_internal_consistency(ws);
    assert(end <= top);
    if (end > top) {
        DEBUGLOG(4, "cwksp: table alloc failed!");
        ws->allocFailed = 1;
        return NULL;
    }
    ws->tableEnd = end;

#if ZSTD_ADDRESS_SANITIZER && !defined (ZSTD_ASAN_DONT_POISON_WORKSPACE)
    if (ws->isStatic == ZSTD_cwksp_dynamic_alloc) {
        __asan_unpoison_memory_region(alloc, bytes);
    }
#endif

    assert((bytes & (ZSTD_CWKSP_ALIGNMENT_BYTES-1)) == 0);
    assert(((size_t)alloc & (ZSTD_CWKSP_ALIGNMENT_BYTES-1))== 0);
    return alloc;
}